

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O2

void __thiscall winmd::reader::TypeSig::TypeSig(TypeSig *this,table_base *table,byte_view *data)

{
  bool bVar1;
  ElementType EVar2;
  int iVar3;
  pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  uint32_t *local_38;
  
  bVar1 = parse_szarray(table,data);
  this->m_is_szarray = bVar1;
  bVar1 = parse_array(table,data);
  this->m_is_array = bVar1;
  iVar3 = parse_ptr(table,data);
  this->m_ptr_count = iVar3;
  parse_cmods(&this->m_cmod,table,data);
  EVar2 = parse_element_type(data);
  this->m_element_type = EVar2;
  ParseType(&this->m_type,table,data);
  this->m_array_rank = 0;
  (this->m_array_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_array_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_array_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->m_is_array == true) {
    parse_array_sizes(&local_60,table,data);
    local_38 = &this->m_array_rank;
    local_40 = &this->m_array_sizes;
    std::tuple<unsigned_int&,std::vector<unsigned_int,std::allocator<unsigned_int>>&>::operator=
              ((tuple<unsigned_int&,std::vector<unsigned_int,std::allocator<unsigned_int>>&> *)
               &local_40,&local_60);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&local_60.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  return;
}

Assistant:

TypeSig(table_base const* table, byte_view& data)
            : m_is_szarray(parse_szarray(table, data))
            , m_is_array(parse_array(table, data))
            , m_ptr_count(parse_ptr(table, data))
            , m_cmod(parse_cmods(table, data))
            , m_element_type(parse_element_type(data))
            , m_type(ParseType(table, data))
        {
            if (m_is_array)
            {
                std::tie(m_array_rank, m_array_sizes) = parse_array_sizes(table, data);
            }
        }